

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

shared_ptr<int> __thiscall
nonsugar::
value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
::operator()(value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  int iVar1;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<int> sVar2;
  int t;
  sstream_t ss;
  byte abStack_178 [360];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,in_RDX,_S_out|_S_in);
  std::istream::operator>>((istream *)&ss,&t);
  if ((abStack_178[*(long *)(_ss + -0x18)] & 5) == 0) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) {
      std::make_shared<int,int_const&>((int *)this);
      goto LAB_001332de;
    }
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_001332de:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> operator()(String const &s) const
    {
        using sstream_t = detail::sstream<String>;
        sstream_t ss(s);
        T t;
        ss >> t;
        return ss && ss.peek() == sstream_t::traits_type::eof() ?
            detail::copy_shared(t) : nullptr;
    }